

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcp.c
# Opt level: O0

int maybe_new_socket(uv_tcp_t *handle,int domain,unsigned_long flags)

{
  int iVar1;
  int *piVar2;
  socklen_t local_ac;
  undefined1 local_a8 [4];
  socklen_t slen;
  sockaddr_storage saddr;
  unsigned_long flags_local;
  int domain_local;
  uv_tcp_t *handle_local;
  
  if (domain == 0) {
    handle->flags = handle->flags | (uint)flags;
    handle_local._4_4_ = 0;
  }
  else {
    saddr.__ss_align = flags;
    if ((handle->io_watcher).fd == -1) {
      handle_local._4_4_ = new_socket(handle,domain,flags);
    }
    else {
      if ((flags & 0x2000) != 0) {
        if ((handle->flags & 0x2000) != 0) {
          handle->flags = handle->flags | (uint)flags;
          return 0;
        }
        local_ac = 0x80;
        memset(local_a8,0,0x80);
        iVar1 = getsockname((handle->io_watcher).fd,(sockaddr *)local_a8,&local_ac);
        if (iVar1 != 0) {
          piVar2 = __errno_location();
          return -*piVar2;
        }
        if (((local_a8._0_2_ == 10) && (local_a8._2_2_ != 0)) ||
           ((local_a8._0_2_ == 2 && (local_a8._2_2_ != 0)))) {
          handle->flags = handle->flags | (uint)saddr.__ss_align;
          return 0;
        }
        iVar1 = bind((handle->io_watcher).fd,(sockaddr *)local_a8,local_ac);
        if (iVar1 != 0) {
          piVar2 = __errno_location();
          return -*piVar2;
        }
      }
      handle->flags = handle->flags | (uint)saddr.__ss_align;
      handle_local._4_4_ = 0;
    }
  }
  return handle_local._4_4_;
}

Assistant:

static int maybe_new_socket(uv_tcp_t* handle, int domain, unsigned long flags) {
  struct sockaddr_storage saddr;
  socklen_t slen;

  if (domain == AF_UNSPEC) {
    handle->flags |= flags;
    return 0;
  }

  if (uv__stream_fd(handle) != -1) {

    if (flags & UV_HANDLE_BOUND) {

      if (handle->flags & UV_HANDLE_BOUND) {
        /* It is already bound to a port. */
        handle->flags |= flags;
        return 0;
      }

      /* Query to see if tcp socket is bound. */
      slen = sizeof(saddr);
      memset(&saddr, 0, sizeof(saddr));
      if (getsockname(uv__stream_fd(handle), (struct sockaddr*) &saddr, &slen))
        return UV__ERR(errno);

      if ((saddr.ss_family == AF_INET6 &&
          ((struct sockaddr_in6*) &saddr)->sin6_port != 0) ||
          (saddr.ss_family == AF_INET &&
          ((struct sockaddr_in*) &saddr)->sin_port != 0)) {
        /* Handle is already bound to a port. */
        handle->flags |= flags;
        return 0;
      }

      /* Bind to arbitrary port */
      if (bind(uv__stream_fd(handle), (struct sockaddr*) &saddr, slen))
        return UV__ERR(errno);
    }

    handle->flags |= flags;
    return 0;
  }

  return new_socket(handle, domain, flags);
}